

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall json::Json::Json(Json *this,istream *istream)

{
  _Rb_tree_header *p_Var1;
  long *local_48 [2];
  long local_38 [2];
  
  this->type = IsInvalid;
  (this->object).super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  p_Var1 = &(this->object).fields._M_t._M_impl.super__Rb_tree_header;
  (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->array).super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  (this->array).fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->array).fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->array).fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)local_48,
             *(undefined8 *)(istream + *(long *)(*(long *)istream + -0x18) + 0xe8),0xffffffff,0,
             0xffffffff);
  init(this,(EVP_PKEY_CTX *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

explicit Json(std::istream& istream) : type(IsInvalid) {
            init(std::string(std::istreambuf_iterator<char>(istream), std::istreambuf_iterator<char>()));
        }